

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O2

bool __thiscall Token::operator==(Token *this,Token *rhs)

{
  bool bVar1;
  
  if (this->mType == rhs->mType) {
    bVar1 = NumericConstant::operator!=(&this->mNumericValue,&rhs->mNumericValue);
    if (((bVar1) || (this->mCharValue != rhs->mCharValue)) ||
       (this->mCharValue2 != rhs->mCharValue2)) {
      bVar1 = false;
    }
    else {
      bVar1 = std::operator!=(&this->mIdentifier,&rhs->mIdentifier);
      bVar1 = !bVar1;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool Token::operator==(const Token& rhs) const {
	if (mType != rhs.mType) {
		return false;
	}

	if (mNumericValue != rhs.numericValue()) {
		return false;
	}

	if (mCharValue != rhs.mCharValue) {
		return false;
	}

	if (mCharValue2 != rhs.mCharValue2) {
		return false;
	}

	if (mIdentifier != rhs.mIdentifier) {
		return false;
	}

	return true;
}